

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::ConvertImageVariableToSampledImage
          (ConvertToSampledImagePass *this,Instruction *image_variable,
          uint32_t sampled_image_type_id)

{
  StorageClass storage_class_00;
  uint32_t type_id_00;
  IRContext *pIVar1;
  TypeManager *pTVar2;
  Type *pTVar3;
  uint32_t type_id;
  StorageClass storage_class;
  Type *sampled_image_type;
  uint32_t sampled_image_type_id_local;
  Instruction *image_variable_local;
  ConvertToSampledImagePass *this_local;
  
  pIVar1 = Pass::context(&this->super_Pass);
  pTVar2 = IRContext::get_type_mgr(pIVar1);
  pTVar3 = analysis::TypeManager::GetType(pTVar2,sampled_image_type_id);
  if (pTVar3 == (Type *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    storage_class_00 = GetStorageClass(this,image_variable);
    if (storage_class_00 == Max) {
      this_local._7_1_ = false;
    }
    else {
      pIVar1 = Pass::context(&this->super_Pass);
      pTVar2 = IRContext::get_type_mgr(pIVar1);
      type_id_00 = analysis::TypeManager::FindPointerToType
                             (pTVar2,sampled_image_type_id,storage_class_00);
      MoveInstructionNextToType(this,image_variable,type_id_00);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ConvertToSampledImagePass::ConvertImageVariableToSampledImage(
    Instruction* image_variable, uint32_t sampled_image_type_id) {
  auto* sampled_image_type =
      context()->get_type_mgr()->GetType(sampled_image_type_id);
  if (sampled_image_type == nullptr) return false;
  auto storage_class = GetStorageClass(*image_variable);
  if (storage_class == spv::StorageClass::Max) return false;
  // Make sure |image_variable| is behind its type i.e., avoid the forward
  // reference.
  uint32_t type_id = context()->get_type_mgr()->FindPointerToType(
      sampled_image_type_id, storage_class);
  MoveInstructionNextToType(image_variable, type_id);
  return true;
}